

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

size_t __thiscall
llvm::cl::opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_>::getOptionWidth
          (opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *this)

{
  size_t sVar1;
  
  sVar1 = basic_parser_impl::getOptionWidth((basic_parser_impl *)&this->Parser,&this->super_Option);
  return sVar1;
}

Assistant:

size_t getOptionWidth() const override {
    return Parser.getOptionWidth(*this);
  }